

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O0

void slang::ast::createCondGenBlock
               (Compilation *compilation,SyntaxNode *syntax,ASTContext *context,
               uint32_t constructIndex,bool isInstantiated,
               SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,
               SmallVectorBase<slang::ast::GenerateBlockSymbol_*> *results)

{
  GenerateBlockSymbol *this;
  IfGenerateSyntax *syntax_00;
  CaseGenerateSyntax *syntax_01;
  Scope *scope;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_02;
  GenerateBlockSymbol *local_60;
  GenerateBlockSymbol *block;
  SourceLocation local_48;
  SourceLocation loc;
  string_view name;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes_local;
  bool isInstantiated_local;
  ASTContext *pAStack_20;
  uint32_t constructIndex_local;
  ASTContext *context_local;
  SyntaxNode *syntax_local;
  Compilation *compilation_local;
  
  attributes_local._3_1_ = isInstantiated;
  attributes_local._4_4_ = constructIndex;
  pAStack_20 = context;
  context_local = (ASTContext *)syntax;
  syntax_local = (SyntaxNode *)compilation;
  if (syntax->kind == CaseGenerate) {
    syntax_01 = slang::syntax::SyntaxNode::as<slang::syntax::CaseGenerateSyntax>(syntax);
    GenerateBlockSymbol::fromSyntax
              (compilation,syntax_01,pAStack_20,attributes_local._4_4_,
               (bool)(attributes_local._3_1_ & 1),results);
  }
  else if (syntax->kind == IfGenerate) {
    syntax_00 = slang::syntax::SyntaxNode::as<slang::syntax::IfGenerateSyntax>(syntax);
    GenerateBlockSymbol::fromSyntax
              (compilation,syntax_00,pAStack_20,attributes_local._4_4_,
               (bool)(attributes_local._3_1_ & 1),results);
  }
  else {
    _loc = getGenerateBlockName(syntax);
    _block = slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)context_local);
    local_48 = parsing::Token::location((Token *)&block);
    local_60 = BumpAllocator::
               emplace<slang::ast::GenerateBlockSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,unsigned_int&,bool&>
                         ((BumpAllocator *)syntax_local,(Compilation *)syntax_local,
                          (basic_string_view<char,_std::char_traits<char>_> *)&loc,&local_48,
                          (uint *)((long)&attributes_local + 4),
                          (bool *)((long)&attributes_local + 3));
    Symbol::setSyntax(&local_60->super_Symbol,(SyntaxNode *)context_local);
    this = local_60;
    scope = not_null<const_slang::ast::Scope_*>::operator*(&pAStack_20->scope);
    syntax_02 = slang::syntax::SyntaxList::operator_cast_to_span((SyntaxList *)attributes);
    Symbol::setAttributes(&this->super_Symbol,scope,syntax_02);
    SmallVectorBase<slang::ast::GenerateBlockSymbol_*>::push_back(results,&local_60);
    if ((attributes_local._3_1_ & 1) != 0) {
      addBlockMembers(local_60,(SyntaxNode *)context_local);
    }
  }
  return;
}

Assistant:

static void createCondGenBlock(Compilation& compilation, const SyntaxNode& syntax,
                               const ASTContext& context, uint32_t constructIndex,
                               bool isInstantiated,
                               const SyntaxList<AttributeInstanceSyntax>& attributes,
                               SmallVectorBase<GenerateBlockSymbol*>& results) {
    // [27.5] If a generate block in a conditional generate construct consists of only one item
    // that is itself a conditional generate construct and if that item is not surrounded by
    // begin-end keywords, then this generate block is not treated as a separate scope. The
    // generate construct within this block is said to be directly nested. The generate blocks
    // of the directly nested construct are treated as if they belong to the outer construct.
    switch (syntax.kind) {
        case SyntaxKind::IfGenerate:
            GenerateBlockSymbol::fromSyntax(compilation, syntax.as<IfGenerateSyntax>(), context,
                                            constructIndex, isInstantiated, results);
            return;
        case SyntaxKind::CaseGenerate:
            GenerateBlockSymbol::fromSyntax(compilation, syntax.as<CaseGenerateSyntax>(), context,
                                            constructIndex, isInstantiated, results);
            return;
        default:
            break;
    }

    string_view name = getGenerateBlockName(syntax);
    SourceLocation loc = syntax.getFirstToken().location();

    auto block = compilation.emplace<GenerateBlockSymbol>(compilation, name, loc, constructIndex,
                                                          isInstantiated);
    block->setSyntax(syntax);
    block->setAttributes(*context.scope, attributes);
    results.push_back(block);

    if (isInstantiated)
        addBlockMembers(*block, syntax);
}